

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yprp_revision(lys_ypr_ctx_conflict *pctx,lysp_revision *rev)

{
  uint16_t *puVar1;
  lysp_ext_instance *plVar2;
  uint uVar3;
  lysp_ext_instance *plVar4;
  ulong uVar5;
  uint64_t u;
  lysp_ext_instance *plVar6;
  lysp_ext_instance *ext;
  
  if (((rev->dsc == (char *)0x0) && (rev->ref == (char *)0x0)) &&
     (rev->exts == (lysp_ext_instance *)0x0)) {
    ypr_open(pctx,"revision","date",rev->date,-1);
    return;
  }
  ypr_open(pctx,"revision","date",rev->date,'\x01');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  plVar2 = rev->exts;
  plVar6 = (lysp_ext_instance *)0x0;
  ext = plVar2;
  while( true ) {
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar2[-1].exts;
    }
    if (plVar4 <= plVar6) break;
    yprp_extension_instance(pctx,LY_STMT_REVISION,'\0',ext,(int8_t *)0x0);
    plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
    ext = ext + 1;
  }
  ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',rev->dsc,rev->exts);
  ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',rev->ref,rev->exts);
  uVar3 = *(int *)((long)&pctx->field_0 + 8) - 1;
  (pctx->field_0).field_0.level = (uint16_t)uVar3;
  uVar5 = (ulong)((uVar3 & 0xffff) * 2);
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
      (undefined1  [24])0x0) {
    uVar5 = 0;
  }
  ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",uVar5,"","revision");
  return;
}

Assistant:

static void
yprp_revision(struct lys_ypr_ctx *pctx, const struct lysp_revision *rev)
{
    if (rev->dsc || rev->ref || rev->exts) {
        ypr_open(pctx, "revision", "date", rev->date, 1);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_REVISION, 0, rev->exts, NULL);
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, rev->dsc, rev->exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, rev->ref, rev->exts);
        LEVEL--;
        ypr_close(pctx, "revision", 1);
    } else {
        ypr_open(pctx, "revision", "date", rev->date, -1);
    }
}